

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageFieldLiteGenerator::GenerateParsingCode
          (ImmutableLazyMessageFieldLiteGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableLazyMessageFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldLiteGenerator).variables_,
                     "if ($name$_ == null) {\n  $name$_ = new com.google.protobuf.LazyFieldLite();\n}\n$name$_.mergeFrom(input, extensionRegistry);\n"
                    );
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldLiteGenerator).variables_,
                     "$set_has_field_bit_message$\n");
  return;
}

Assistant:

void ImmutableLazyMessageFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if ($name$_ == null) {\n"
    "  $name$_ = new com.google.protobuf.LazyFieldLite();\n"
    "}\n"
    "$name$_.mergeFrom(input, extensionRegistry);\n");
  printer->Print(variables_,
    "$set_has_field_bit_message$\n");
}